

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O3

bool __thiscall
QTableModel::setHeaderData
          (QTableModel *this,int section,Orientation orientation,QVariant *value,int role)

{
  ulong uVar1;
  long *plVar2;
  long lVar3;
  
  if (section < 0) {
    return false;
  }
  if (orientation == Horizontal) {
    lVar3 = 0x50;
    uVar1 = (this->horizontalHeaderItems).d.size;
  }
  else {
    if (orientation != Vertical) {
      lVar3 = 0x38;
      goto LAB_00593909;
    }
    lVar3 = 0x38;
    uVar1 = (this->verticalHeaderItems).d.size;
  }
  if (uVar1 <= (uint)section) {
    return false;
  }
LAB_00593909:
  plVar2 = *(long **)(*(long *)(&this->super_QAbstractTableModel + lVar3) + (ulong)(uint)section * 8
                     );
  if (plVar2 == (long *)0x0) {
    return false;
  }
  (**(code **)(*plVar2 + 0x20))(plVar2,role,value);
  return true;
}

Assistant:

bool QTableModel::setHeaderData(int section, Qt::Orientation orientation,
                                const QVariant &value, int role)
{
    if (section < 0 ||
       (orientation == Qt::Horizontal && horizontalHeaderItems.size() <= section) ||
       (orientation == Qt::Vertical && verticalHeaderItems.size() <= section))
    return false;

    QTableWidgetItem *itm = nullptr;
    if (orientation == Qt::Horizontal)
        itm = horizontalHeaderItems.at(section);
    else
        itm = verticalHeaderItems.at(section);
    if (itm) {
        itm->setData(role, value);
        return true;
    }
    return false;
}